

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void calc_num_proj_ref(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mi)

{
  byte bVar1;
  uint *puVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  MOTION_MODE last_motion_mode_allowed;
  int *pts_inref0;
  int *pts0;
  WARP_SAMPLE_INFO *warp_sample_info;
  FeatureFlags *features;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int *in_stack_00000070;
  int *in_stack_00000078;
  MACROBLOCKD *in_stack_00000080;
  AV1_COMMON *in_stack_00000088;
  MB_MODE_INFO *in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  MOTION_MODE MVar3;
  
  *(undefined1 *)(in_RDX + 0x19) = 1;
  puVar2 = (uint *)(in_RSI + 0x15de0 + (long)*(char *)(in_RDX + 0x10) * 0x84);
  MVar3 = '\0';
  if ((*(byte *)(in_RDI + 0x3c177) & 1) != 0) {
    MVar3 = motion_mode_allowed((WarpedMotionParams *)(puVar2 + 0x11),
                                (MACROBLOCKD *)(ulong)in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8,0);
  }
  if (MVar3 == '\x02') {
    if ((int)*puVar2 < 0) {
      bVar1 = av1_findSamples(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                              in_stack_00000070);
      *puVar2 = (uint)bVar1;
    }
    *(char *)(in_RDX + 0x19) = (char)*puVar2;
  }
  return;
}

Assistant:

static void calc_num_proj_ref(AV1_COMP *cpi, MACROBLOCK *x, MB_MODE_INFO *mi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  const FeatureFlags *const features = &cm->features;

  mi->num_proj_ref = 1;
  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;

  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    if (warp_sample_info->num < 0) {
      warp_sample_info->num = av1_findSamples(cm, xd, pts0, pts_inref0);
    }
    mi->num_proj_ref = warp_sample_info->num;
  }
}